

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::String::_opVFormat(String *this,ModifyOp op,char *fmt,__va_list_tag *ap)

{
  Error EVar1;
  int iVar2;
  size_t sVar3;
  ulong __maxlen;
  char *pcVar4;
  undefined8 *in_RCX;
  char *in_RDX;
  int in_ESI;
  char *p;
  va_list apCopy;
  size_t outputSize;
  int fmtResult;
  char buf [1024];
  size_t remainingCapacity;
  size_t startAt;
  size_t in_stack_fffffffffffffb78;
  String *in_stack_fffffffffffffb80;
  String *this_00;
  String *this_01;
  size_t in_stack_fffffffffffffb90;
  ModifyOp op_00;
  String *this_02;
  ulong local_448;
  int local_43c;
  size_t in_stack_fffffffffffffbc8;
  ModifyOp in_stack_fffffffffffffbd4;
  String *in_stack_fffffffffffffbd8;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  Error local_4;
  
  if (in_ESI == 0) {
    this_00 = (String *)0x0;
  }
  else {
    this_00 = (String *)size(in_stack_fffffffffffffb80);
  }
  this_01 = this_00;
  sVar3 = capacity(this_00);
  __maxlen = sVar3 - (long)this_00;
  this_02 = (String *)in_RCX[2];
  pcVar4 = (char *)*in_RCX;
  op_00 = (ModifyOp)((ulong)in_RCX[1] >> 0x20);
  if (__maxlen < 0x80) {
    local_43c = vsnprintf(&stack0xfffffffffffffbc8,0x400,in_RDX,in_RCX);
    local_448 = (ulong)local_43c;
    if (local_448 < 0x400) {
      EVar1 = _opString(this_02,op_00,pcVar4,in_stack_fffffffffffffb90);
      return EVar1;
    }
  }
  else {
    pcVar4 = data(this_01);
    local_43c = vsnprintf(pcVar4 + (long)this_00,__maxlen,in_RDX,in_RCX);
    local_448 = (ulong)local_43c;
    if (local_448 <= __maxlen) {
      _setSize(this_01,in_stack_fffffffffffffb78);
      return 0;
    }
  }
  if (local_43c < 0) {
    local_4 = DebugUtils::errored(3);
  }
  else {
    pcVar4 = prepare(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,in_stack_fffffffffffffbc8);
    if (pcVar4 == (char *)0x0) {
      local_4 = DebugUtils::errored(1);
    }
    else {
      iVar2 = vsnprintf(pcVar4,local_448 + 1,in_RDX,&stack0xfffffffffffffb98);
      if ((long)iVar2 != local_448) {
        DebugUtils::assertionFailed
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

Error String::_opVFormat(ModifyOp op, const char* fmt, va_list ap) noexcept {
  size_t startAt = (op == ModifyOp::kAssign) ? size_t(0) : size();
  size_t remainingCapacity = capacity() - startAt;

  char buf[1024];
  int fmtResult;
  size_t outputSize;

  va_list apCopy;
  va_copy(apCopy, ap);

  if (remainingCapacity >= 128) {
    fmtResult = vsnprintf(data() + startAt, remainingCapacity, fmt, ap);
    outputSize = size_t(fmtResult);

    if (ASMJIT_LIKELY(outputSize <= remainingCapacity)) {
      _setSize(startAt + outputSize);
      return kErrorOk;
    }
  }
  else {
    fmtResult = vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf), fmt, ap);
    outputSize = size_t(fmtResult);

    if (ASMJIT_LIKELY(outputSize < ASMJIT_ARRAY_SIZE(buf)))
      return _opString(op, buf, outputSize);
  }

  if (ASMJIT_UNLIKELY(fmtResult < 0))
    return DebugUtils::errored(kErrorInvalidState);

  char* p = prepare(op, outputSize);
  if (ASMJIT_UNLIKELY(!p))
    return DebugUtils::errored(kErrorOutOfMemory);

  fmtResult = vsnprintf(p, outputSize + 1, fmt, apCopy);
  ASMJIT_ASSERT(size_t(fmtResult) == outputSize);

  return kErrorOk;
}